

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_plats.cpp
# Opt level: O3

void EV_StopPlat(int tag,bool remove)

{
  DThinker *pDVar1;
  DThinker *pDVar2;
  TThinkerIterator<DPlat> iterator;
  FThinkerIterator local_40;
  
  FThinkerIterator::FThinkerIterator(&local_40,DPlat::RegistrationInfo.MyClass,0x80);
  pDVar1 = FThinkerIterator::Next(&local_40);
  if (pDVar1 != (DThinker *)0x0) {
    do {
      pDVar2 = FThinkerIterator::Next(&local_40);
      if ((*(int *)&pDVar1[1].PrevThinker != 3) &&
         (*(int *)((long)&pDVar1[2].super_DObject._vptr_DObject + 4) == tag)) {
        if (remove) {
          (*(pDVar1->super_DObject)._vptr_DObject[4])(pDVar1);
        }
        else {
          *(int *)((long)&pDVar1[1].PrevThinker + 4) = *(int *)&pDVar1[1].PrevThinker;
          *(undefined4 *)&pDVar1[1].PrevThinker = 3;
        }
      }
      pDVar1 = pDVar2;
    } while (pDVar2 != (DThinker *)0x0);
  }
  return;
}

Assistant:

void EV_StopPlat (int tag, bool remove)
{
	DPlat *scan;
	TThinkerIterator<DPlat> iterator;

	scan = iterator.Next();
	while (scan != nullptr)
	{
		DPlat *next = iterator.Next();
		if (scan->m_Status != DPlat::in_stasis && scan->m_Tag == tag)
		{
			if (!remove) scan->Stop();
			else scan->Destroy();
		}
		scan = next;
	}
}